

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::image::anon_unknown_2::BinaryAtomicInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,BinaryAtomicInstanceBase *this)

{
  TextureFormat *format;
  UVec3 *pUVar1;
  MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_00;
  MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *this_01;
  VkImage image;
  VkImageView obj;
  long lVar2;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined8 uVar7;
  deUint32 dVar8;
  int iVar9;
  deUint32 dVar10;
  uint uVar11;
  deUint32 dVar12;
  VkImageViewType imageViewType;
  VkFormat format_00;
  uint uVar13;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue queue;
  Allocator *allocator;
  Image *this_02;
  Buffer *this_03;
  const_iterator cVar14;
  uint uVar15;
  uint uVar16;
  TestStatus *pTVar17;
  ulong bufferSize;
  uint uVar18;
  uint z;
  uint y;
  ulong bufferSize_00;
  bool bVar19;
  VkExtent3D extent;
  UVec3 gridSize;
  long *local_378;
  long local_370;
  long local_368 [2];
  TestStatus *local_358;
  UVec3 *local_350;
  VkImageMemoryBarrier resultImagePreCopyBarrier;
  undefined1 local_2e8 [24];
  undefined1 auStack_2d0 [24];
  undefined1 local_2b8 [40];
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_290;
  undefined8 local_278;
  undefined8 uStack_270;
  deUint32 local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  deUint32 local_248;
  VkCommandPool local_238;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_230;
  VkPipeline local_218;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_210;
  VkShaderModule local_1f8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1f0;
  VkImageMemoryBarrier resultImagePostCopyBarrier;
  IVec4 initialValue;
  PixelBufferAccess inputPixelBuffer;
  VkBufferMemoryBarrier outputBufferPreHostReadBarrier;
  VkBufferImageCopy bufferImageCopyParams;
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  VkImageCreateInfo local_88;
  
  local_358 = __return_storage_ptr__;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar8 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  format = &this->m_format;
  iVar9 = tcu::getPixelSize(this->m_format);
  pUVar1 = &this->m_imageSize;
  dVar10 = getNumPixels(this->m_imageType,pUVar1);
  uVar11 = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = (uint)(this->m_imageType - IMAGE_TYPE_CUBE < 2) << 4;
  local_88.imageType = mapImageType(this->m_imageType);
  local_88.format = ::vk::mapTextureFormat(format);
  getLayerSize(this->m_imageType,pUVar1);
  local_88.extent.width = resultImagePreCopyBarrier.sType;
  local_88.extent.height = resultImagePreCopyBarrier._4_4_;
  local_88.extent.depth = (deUint32)resultImagePreCopyBarrier.pNext;
  local_88.mipLevels = 1;
  local_350 = pUVar1;
  local_88.arrayLayers = getNumLayers(this->m_imageType,pUVar1);
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.usage = 0xb;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (deUint32 *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this_02 = (Image *)operator_new(0x30);
  Image::Image(this_02,vk,device,allocator,&local_88,(MemoryRequirement)0x0);
  pUVar1 = local_350;
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  this_01 = &this->m_resultImage;
  if ((this->m_resultImage).
      super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr !=
      this_02) {
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              (&this_01->super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
              );
    (this_01->super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>).m_data.
    ptr = this_02;
  }
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
            ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
             &resultImagePreCopyBarrier);
  dVar12 = getNumLayers(this->m_imageType,pUVar1);
  image.m_internal =
       (((this->m_resultImage).
         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
       m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageViewType = mapImageViewType(this->m_imageType);
  format_00 = ::vk::mapTextureFormat(format);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar12;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&resultImagePostCopyBarrier,vk,device,image
                ,imageViewType,format_00,subresourceRange);
  uVar4 = resultImagePostCopyBarrier._0_8_;
  pvVar6 = resultImagePostCopyBarrier.pNext;
  uVar5 = resultImagePostCopyBarrier._16_8_;
  uVar7 = resultImagePostCopyBarrier._24_8_;
  resultImagePreCopyBarrier.srcAccessMask = resultImagePostCopyBarrier.srcAccessMask;
  resultImagePreCopyBarrier.dstAccessMask = resultImagePostCopyBarrier.dstAccessMask;
  resultImagePreCopyBarrier.oldLayout = resultImagePostCopyBarrier.oldLayout;
  resultImagePreCopyBarrier.newLayout = resultImagePostCopyBarrier.newLayout;
  resultImagePreCopyBarrier.sType = resultImagePostCopyBarrier.sType;
  resultImagePreCopyBarrier._4_4_ = resultImagePostCopyBarrier._4_4_;
  resultImagePreCopyBarrier.pNext = resultImagePostCopyBarrier.pNext;
  resultImagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePostCopyBarrier._4_4_ = 0;
  resultImagePostCopyBarrier.pNext = (void *)0x0;
  resultImagePostCopyBarrier.srcAccessMask = 0;
  resultImagePostCopyBarrier.dstAccessMask = 0;
  resultImagePostCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePostCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  obj.m_internal =
       (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)uVar5;
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)uVar7;
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = uVar4;
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj);
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device
         = (VkDevice)resultImagePreCopyBarrier._16_8_;
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = resultImagePreCopyBarrier._0_8_;
    (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
    if (resultImagePostCopyBarrier._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&resultImagePostCopyBarrier.pNext,
                 (VkImageView)resultImagePostCopyBarrier._0_8_);
    }
  }
  bufferSize_00 = (ulong)(dVar10 * iVar9);
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImagePreCopyBarrier,bufferSize_00,1);
  image::Buffer::Buffer
            ((Buffer *)local_2e8,vk,device,allocator,
             (VkBufferCreateInfo *)&resultImagePreCopyBarrier,(MemoryRequirement)0x1);
  uVar4 = local_2e8._0_8_;
  initialValue.m_data[0] = -1;
  if ((ulong)this->m_operation < 7) {
    initialValue.m_data[0] = *(int *)(&DAT_00b3a9b8 + (ulong)this->m_operation * 4);
  }
  initialValue.m_data[1] = initialValue.m_data[0];
  initialValue.m_data[2] = initialValue.m_data[0];
  initialValue.m_data[3] = initialValue.m_data[0];
  getShaderGridSize((image *)&gridSize,this->m_imageType,pUVar1);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&inputPixelBuffer,format,gridSize.m_data[0],gridSize.m_data[1],gridSize.m_data[2],
             *(void **)(uVar4 + 0x18));
  if (gridSize.m_data[2] != 0) {
    z = 0;
    uVar18 = gridSize.m_data[2];
    uVar13 = gridSize.m_data[1];
    uVar16 = gridSize.m_data[1];
    do {
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        y = 0;
        uVar15 = gridSize.m_data[0];
        do {
          bVar19 = uVar15 != 0;
          uVar15 = 0;
          if (bVar19) {
            uVar18 = 0;
            do {
              tcu::PixelBufferAccess::setPixel(&inputPixelBuffer,&initialValue,uVar18,y,z);
              uVar18 = uVar18 + 1;
              uVar13 = gridSize.m_data[1];
              uVar15 = gridSize.m_data[0];
            } while (uVar18 < gridSize.m_data[0]);
          }
          y = y + 1;
          uVar18 = gridSize.m_data[2];
          uVar16 = uVar13;
        } while (y < uVar13);
      }
      z = z + 1;
    } while (z < uVar18);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)((VkDeviceMemory *)(uVar4 + 8))->m_internal,
             *(VkDeviceSize *)(uVar4 + 0x10),bufferSize_00);
  this_03 = (Buffer *)operator_new(0x30);
  bufferSize = (ulong)uVar11;
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImagePreCopyBarrier,bufferSize,2);
  image::Buffer::Buffer
            (this_03,vk,device,allocator,(VkBufferCreateInfo *)&resultImagePreCopyBarrier,
             (MemoryRequirement)0x1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = resultImagePostCopyBarrier.pNext;
  resultImagePostCopyBarrier._0_16_ = auVar3 << 0x40;
  this_00 = &this->m_outputBuffer;
  if ((this->m_outputBuffer).
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr !=
      this_03) {
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&this_00->
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
    (this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data.
    ptr = this_03;
  }
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
            ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
             &resultImagePostCopyBarrier);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this);
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,&this->m_name);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImagePreCopyBarrier,vk,device,
             *(ProgramBinary **)(cVar14._M_node + 2),0);
  DStack_1f0.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_1f0.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_1f8.m_internal = resultImagePreCopyBarrier._0_8_;
  DStack_1f0.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImagePreCopyBarrier,vk,device,
                     (VkDescriptorSetLayout)
                     (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                     m_data.object.m_internal);
  DStack_290.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_290.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_2b8._32_8_ = resultImagePreCopyBarrier._0_8_;
  DStack_290.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&resultImagePreCopyBarrier,vk,device,
                      (VkPipelineLayout)resultImagePreCopyBarrier._0_8_,local_1f8);
  DStack_210.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_210.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_218.m_internal = resultImagePreCopyBarrier._0_8_;
  DStack_210.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImagePreCopyBarrier,vk,device,2,dVar8,
             (VkAllocationCallbacks *)0x0);
  DStack_230.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_230.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_238.m_internal = resultImagePreCopyBarrier._0_8_;
  DStack_230.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&resultImagePreCopyBarrier,vk,device,
             (VkCommandPool)resultImagePreCopyBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar4 = resultImagePreCopyBarrier._0_8_;
  local_2b8._16_4_ = resultImagePreCopyBarrier.srcAccessMask;
  local_2b8._20_4_ = resultImagePreCopyBarrier.dstAccessMask;
  local_2b8._24_4_ = resultImagePreCopyBarrier.oldLayout;
  local_2b8._28_4_ = resultImagePreCopyBarrier.newLayout;
  local_2b8._0_8_ = resultImagePreCopyBarrier._0_8_;
  local_2b8._8_8_ = resultImagePreCopyBarrier.pNext;
  beginCommandBuffer(vk,(VkCommandBuffer)resultImagePreCopyBarrier._0_8_);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,uVar4,1,local_218.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])(vk,uVar4,1,local_2b8._32_8_,0,1,&this->m_descriptorSet,0,0);
  makeBufferMemoryBarrier
            (&inputBufferPostHostWriteBarrier,0x4000,0x800,(VkBuffer)local_2e8._16_8_,0,
             bufferSize_00);
  local_258 = 1;
  uStack_250 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = dVar12;
  local_248 = dVar12;
  makeImageMemoryBarrier
            (&resultImagePreCopyBarrier,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             (VkImage)(((this_01->
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange_00);
  dVar10 = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,uVar4,1,0x1000,0,0,0,1,&inputBufferPostHostWriteBarrier,1,
             (int)&resultImagePreCopyBarrier);
  pUVar1 = local_350;
  getLayerSize(this->m_imageType,local_350);
  uVar5 = resultImagePostCopyBarrier._0_8_;
  uVar11 = (uint)resultImagePostCopyBarrier.pNext;
  dVar8 = getNumLayers(this->m_imageType,pUVar1);
  extent.height = 0;
  extent.width = uVar11;
  extent.depth = dVar8;
  makeBufferImageCopy(&bufferImageCopyParams,(image *)uVar5,extent,dVar10);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,uVar4,local_2e8._16_8_,
             (((this_01->super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
               ).m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,7,1,(int)&bufferImageCopyParams);
  local_278 = 1;
  uStack_270 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = dVar12;
  local_268 = dVar12;
  makeImageMemoryBarrier
            (&resultImagePostCopyBarrier,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((this_01->
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,uVar4,0x1000,0x800,0,0,0,0,0,1,(int)&resultImagePostCopyBarrier);
  (*(this->super_TestInstance)._vptr_TestInstance[6])(this,uVar4);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,uVar4,(ulong)(gridSize.m_data[0] * 5),(ulong)gridSize.m_data[1]);
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,uVar4);
  makeBufferMemoryBarrier
            (&outputBufferPreHostReadBarrier,0x1000,0x2000,
             (VkBuffer)
             (((this_00->
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data
              .ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,uVar4,0x1000,0x4000,0,0,0,1,&outputBufferPreHostReadBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)uVar4);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)uVar4);
  lVar2 = (long)(((this_00->
                  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).
                  m_data.ptr)->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
             bufferSize);
  iVar9 = (*(this->super_TestInstance)._vptr_TestInstance[8])(this,lVar2);
  local_378 = local_368;
  if ((char)iVar9 == '\0') {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Comparison failed","");
    pTVar17 = local_358;
    local_358->m_code = QP_TEST_RESULT_FAIL;
    (local_358->m_description)._M_dataplus._M_p = (pointer)&(local_358->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358->m_description,local_378,local_370 + (long)local_378);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Comparison succeeded","");
    pTVar17 = local_358;
    local_358->m_code = QP_TEST_RESULT_PASS;
    (local_358->m_description)._M_dataplus._M_p = (pointer)&(local_358->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358->m_description,local_378,local_370 + (long)local_378);
  }
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  if (uVar4 != 0) {
    resultImagePreCopyBarrier._0_8_ = uVar4;
    (**(code **)(*(long *)local_2b8._8_8_ + 0x240))
              (local_2b8._8_8_,local_2b8._16_8_,local_2b8._24_8_,1);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_230,local_238);
  }
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_210,local_218);
  }
  if (local_2b8._32_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_290,(VkPipelineLayout)local_2b8._32_8_);
  }
  if (local_1f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_1f0,local_1f8);
  }
  if (local_2e8._16_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)auStack_2d0,(VkBuffer)local_2e8._16_8_);
  }
  auStack_2d0._8_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffd28 = (undefined1  [16])0x0;
  if ((Allocation *)local_2e8._0_8_ != (Allocation *)0x0) {
    (*(*(_func_int ***)local_2e8._0_8_)[1])();
  }
  return pTVar17;
}

Assistant:

tcu::TestStatus	BinaryAtomicInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();
	const VkDeviceSize		imageSizeInBytes	= tcu::getPixelSize(m_format) * getNumPixels(m_imageType, m_imageSize);
	const VkDeviceSize		outBuffSizeInBytes	= getOutputBufferSize();

	const VkImageCreateInfo imageParams	=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,					// VkStructureType			sType;
		DE_NULL,												// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),								// VkImageCreateFlags		flags;
		mapImageType(m_imageType),								// VkImageType				imageType;
		mapTextureFormat(m_format),								// VkFormat					format;
		makeExtent3D(getLayerSize(m_imageType, m_imageSize)),	// VkExtent3D				extent;
		1u,														// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),					// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,									// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,								// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
		VK_IMAGE_USAGE_TRANSFER_DST_BIT,						// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,								// VkSharingMode			sharingMode;
		0u,														// deUint32					queueFamilyIndexCount;
		DE_NULL,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,								// VkImageLayout			initialLayout;
	};

	//Create the image that is going to store results of atomic operations
	m_resultImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_resultImageView = makeImageView(deviceInterface, device, m_resultImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);

	//Prepare the buffer with the initial data for the image
	const Buffer inputBuffer(deviceInterface, device, allocator, makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	Allocation& inputBufferAllocation = inputBuffer.getAllocation();

	//Prepare the initial data for the image
	const tcu::IVec4 initialValue(getOperationInitialValue(m_operation));

	tcu::UVec3 gridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::PixelBufferAccess inputPixelBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), inputBufferAllocation.getHostPtr());

	for (deUint32 z = 0; z < gridSize.z(); z++)
	for (deUint32 y = 0; y < gridSize.y(); y++)
	for (deUint32 x = 0; x < gridSize.x(); x++)
	{
		inputPixelBuffer.setPixel(initialValue, x, y, z);
	}

	flushMappedMemoryRange(deviceInterface, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), imageSizeInBytes);

	// Create a buffer to store shader output copied from result image
	m_outputBuffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, makeBufferCreateInfo(outBuffSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

	prepareResources();

	prepareDescriptors();

	// Create pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const Unique<VkPipeline>		pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool>		cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier	=
		makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT,
								VK_ACCESS_TRANSFER_READ_BIT,
								*inputBuffer,
								0ull,
								imageSizeInBytes);

	const VkImageMemoryBarrier	resultImagePreCopyBarrier =
		makeImageMemoryBarrier(	0u,
								VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_IMAGE_LAYOUT_UNDEFINED,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, DE_FALSE, 0u, DE_NULL, 1u, &inputBufferPostHostWriteBarrier, 1u, &resultImagePreCopyBarrier);

	const VkBufferImageCopy		bufferImageCopyParams = makeBufferImageCopy(makeExtent3D(getLayerSize(m_imageType, m_imageSize)), getNumLayers(m_imageType, m_imageSize));

	deviceInterface.cmdCopyBufferToImage(*cmdBuffer, *inputBuffer, m_resultImage->get(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &bufferImageCopyParams);

	const VkImageMemoryBarrier	resultImagePostCopyBarrier	=
		makeImageMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_ACCESS_SHADER_READ_BIT,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								VK_IMAGE_LAYOUT_GENERAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &resultImagePostCopyBarrier);

	commandsBeforeCompute(*cmdBuffer);

	deviceInterface.cmdDispatch(*cmdBuffer, NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	commandsAfterCompute(*cmdBuffer);

	const VkBufferMemoryBarrier	outputBufferPreHostReadBarrier
		= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
									VK_ACCESS_HOST_READ_BIT,
									m_outputBuffer->get(),
									0ull,
									outBuffSizeInBytes);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, DE_FALSE, 0u, DE_NULL, 1u, &outputBufferPreHostReadBarrier, 0u, DE_NULL);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	Allocation& outputBufferAllocation = m_outputBuffer->getAllocation();

	invalidateMappedMemoryRange(deviceInterface, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outBuffSizeInBytes);

	if (verifyResult(outputBufferAllocation))
		return tcu::TestStatus::pass("Comparison succeeded");
	else
		return tcu::TestStatus::fail("Comparison failed");
}